

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix.c
# Opt level: O2

void tmult(double *A,double *B,double *C,int ra,int ca,int cb)

{
  double *col;
  ulong uVar1;
  ulong uVar2;
  long lVar3;
  double *pdVar4;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  long lVar8;
  ulong uVar9;
  double dVar10;
  
  lVar8 = (long)ca;
  col = (double *)malloc(lVar8 * 8 * (long)cb);
  mtranspose(B,ca,cb,col);
  uVar1 = 0;
  uVar9 = (ulong)(uint)ca;
  if (ca < 1) {
    uVar9 = uVar1;
  }
  uVar2 = 0;
  if (0 < cb) {
    uVar2 = (ulong)(uint)cb;
  }
  uVar7 = (ulong)(uint)ra;
  if (ra < 1) {
    uVar7 = uVar1;
  }
  for (; uVar1 != uVar7; uVar1 = uVar1 + 1) {
    lVar3 = uVar1 * (long)cb;
    pdVar4 = col;
    for (uVar5 = 0; uVar5 != uVar2; uVar5 = uVar5 + 1) {
      C[lVar3 + uVar5] = 0.0;
      dVar10 = 0.0;
      for (uVar6 = 0; uVar9 != uVar6; uVar6 = uVar6 + 1) {
        dVar10 = dVar10 + A[uVar6] * pdVar4[uVar6];
        C[lVar3 + uVar5] = dVar10;
      }
      pdVar4 = pdVar4 + lVar8;
    }
    A = A + lVar8;
  }
  free(col);
  return;
}

Assistant:

void tmult(double* A, double* B, double* C,int ra,int ca, int cb) {
	register int i,j,k;
	int u,v,t,rb;
	double *BT;
	BT = (double*) malloc(sizeof(double) * ca * cb);
	/*
	 * C = A * B , where A is a ra*ca matric while B is a rb*cb
	 * with ca = rb
	 * Matrix C is a ra*cb matrix
	 */ 
	 
	mtranspose(B,ca,cb,BT);
	rb = ca;
	#pragma omp parallel for private(i,j,k,v,u,t)
	for (i = 0; i < ra; ++i) {
		for (j = 0; j < cb; ++j) {
			v = i * rb;
			u = i *cb;
			t = j + u;
			C[t] = 0.;
			for (k = 0; k < rb;++k) {
				C[t] += A[k + v] * BT[k + j * rb];
			}
		}
	}
	
	free(BT);

}